

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

void __thiscall
wabt::WastLexer::WastLexer
          (WastLexer *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source,
          string_view filename)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  char *pcVar2;
  string_view local_18;
  
  local_18.size_ = filename.size_;
  local_18.data_ = filename.data_;
  (this->source_)._M_t.
  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl =
       (source->_M_t).
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (source->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  string_view::operator_cast_to_string(&this->filename_,&local_18);
  this->line_ = 1;
  _Var1._M_head_impl =
       (this->source_)._M_t.
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  pcVar2 = (char *)(_Var1._M_head_impl)->data_;
  this->buffer_ = pcVar2;
  this->buffer_end_ = pcVar2 + (_Var1._M_head_impl)->size_;
  this->line_start_ = pcVar2;
  this->token_start_ = pcVar2;
  this->cursor_ = pcVar2;
  return;
}

Assistant:

WastLexer::WastLexer(std::unique_ptr<LexerSource> source, string_view filename)
    : source_(std::move(source)),
      filename_(filename),
      line_(1),
      buffer_(static_cast<const char*>(source_->data())),
      buffer_end_(buffer_ + source_->size()),
      line_start_(buffer_),
      token_start_(buffer_),
      cursor_(buffer_) {}